

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.c
# Opt level: O0

void log_free(LogContext *ctx)

{
  LogContext *ctx_local;
  
  logfclose(ctx);
  bufchain_clear(&ctx->queue);
  if (ctx->currlogfilename != (Filename *)0x0) {
    filename_free(ctx->currlogfilename);
  }
  conf_free(ctx->conf);
  safefree(ctx);
  return;
}

Assistant:

void log_free(LogContext *ctx)
{
    logfclose(ctx);
    bufchain_clear(&ctx->queue);
    if (ctx->currlogfilename)
        filename_free(ctx->currlogfilename);
    conf_free(ctx->conf);
    sfree(ctx);
}